

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdinput.c
# Opt level: O0

void reset_input_controller(j_decompress_ptr cinfo)

{
  undefined8 *puVar1;
  long *in_RDI;
  my_inputctl_ptr inputctl;
  
  puVar1 = (undefined8 *)in_RDI[0x48];
  *puVar1 = consume_markers;
  *(undefined4 *)(puVar1 + 4) = 0;
  *(undefined4 *)((long)puVar1 + 0x24) = 0;
  *(undefined4 *)(puVar1 + 5) = 1;
  (**(code **)(*in_RDI + 0x20))(in_RDI);
  (**(code **)in_RDI[0x49])(in_RDI);
  in_RDI[0x18] = 0;
  return;
}

Assistant:

METHODDEF(void)
reset_input_controller(j_decompress_ptr cinfo)
{
  my_inputctl_ptr inputctl = (my_inputctl_ptr)cinfo->inputctl;

  inputctl->pub.consume_input = consume_markers;
  inputctl->pub.has_multiple_scans = FALSE; /* "unknown" would be better */
  inputctl->pub.eoi_reached = FALSE;
  inputctl->inheaders = TRUE;
  /* Reset other modules */
  (*cinfo->err->reset_error_mgr) ((j_common_ptr)cinfo);
  (*cinfo->marker->reset_marker_reader) (cinfo);
  /* Reset progression state -- would be cleaner if entropy decoder did this */
  cinfo->coef_bits = NULL;
}